

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe29At6(uint8_t *buf)

{
  return (ulong)(((uint)buf[2] | (uint)buf[3] << 8 | (buf[4] & 7) << 0x10) * 0x400 +
                 (uint)buf[1] * 4 | (uint)(*buf >> 6));
}

Assistant:

std::uint64_t readFlUIntLe29At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0x1fffffff);
    return res;
}